

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  void *a;
  FILE *__s;
  uint8_t *__ptr;
  uint64_t __size;
  FILE *f;
  void *arch;
  uint16_t *puStack_4a0;
  int read_successfully;
  uint16_t *attributes;
  float *texcoords;
  uint32_t *triangles;
  uint32_t *puStack_480;
  uint32_t nr_of_triangles;
  uint32_t *vertex_colors;
  float *vertex_normals;
  float *triangle_normals;
  float *vertices;
  uint32_t nr_of_vertices;
  int is_ply;
  int is_stl;
  int idx;
  char *ptr;
  int local_440;
  int j;
  int skip_ply_color;
  int skip_ply_texcoords;
  int skip_ply_normals;
  int output_filename;
  int include_stl_uint16;
  int include_stl_normals;
  char new_filename [1024];
  char *local_20;
  char *filename;
  char **argv_local;
  int argc_local;
  
  if (argc < 3) {
    print_help();
    argv_local._4_4_ = -1;
  }
  else {
    local_20 = (char *)0x0;
    output_filename = 0;
    skip_ply_normals = 0;
    skip_ply_texcoords = 0;
    skip_ply_color = 0;
    j = 0;
    local_440 = 0;
    for (ptr._4_4_ = 1; ptr._4_4_ < argc; ptr._4_4_ = ptr._4_4_ + 1) {
      iVar1 = strcmp(argv[ptr._4_4_],"-i");
      if (iVar1 == 0) {
        if (ptr._4_4_ == argc + -1) {
          printf("I expect a filename after command -i\n");
          return -1;
        }
        ptr._4_4_ = ptr._4_4_ + 1;
        local_20 = argv[ptr._4_4_];
      }
      else {
        iVar1 = strcmp(argv[ptr._4_4_],"-o");
        if (iVar1 == 0) {
          if (ptr._4_4_ == argc + -1) {
            printf("I expect a filename after command -o\n");
            return -1;
          }
          ptr._4_4_ = ptr._4_4_ + 1;
          is_ply = 0;
          _is_stl = argv[ptr._4_4_];
          while (*_is_stl != '\0') {
            *(char *)((long)&include_stl_uint16 + (long)is_ply) = *_is_stl;
            is_ply = is_ply + 1;
            _is_stl = _is_stl + 1;
          }
          *(undefined1 *)((long)&include_stl_uint16 + (long)is_ply) = 0;
          skip_ply_texcoords = 1;
        }
        else {
          iVar1 = strcmp(argv[ptr._4_4_],"-stladd");
          if (iVar1 == 0) {
            if (ptr._4_4_ == argc + -1) {
              printf("I expect an attribute after command -stladd\n");
              return -1;
            }
            ptr._4_4_ = ptr._4_4_ + 1;
            iVar1 = strcmp(argv[ptr._4_4_],"normal");
            if (iVar1 == 0) {
              skip_ply_color = 1;
            }
            else {
              iVar1 = strcmp(argv[ptr._4_4_],"tex_coord");
              if (iVar1 == 0) {
                j = 1;
              }
              else {
                iVar1 = strcmp(argv[ptr._4_4_],"color");
                if (iVar1 != 0) {
                  printf("Unknown attribute %s\n",argv[ptr._4_4_]);
                  return -1;
                }
                local_440 = 1;
              }
            }
          }
          else {
            iVar1 = strcmp(argv[ptr._4_4_],"-plyskip");
            if (iVar1 != 0) {
              printf("Unknown command %s\n",argv[ptr._4_4_]);
              return -1;
            }
            if (ptr._4_4_ == argc + -1) {
              printf("I expect an attribute after command -plyskip\n");
              return -1;
            }
            ptr._4_4_ = ptr._4_4_ + 1;
            iVar1 = strcmp(argv[ptr._4_4_],"normal");
            if (iVar1 == 0) {
              output_filename = 1;
            }
            else {
              iVar1 = strcmp(argv[ptr._4_4_],"uint16");
              if (iVar1 != 0) {
                printf("Unknown attribute %s\n",argv[ptr._4_4_]);
                return -1;
              }
              skip_ply_normals = 1;
            }
          }
        }
      }
    }
    if (local_20 == (char *)0x0) {
      printf("An input file name is required\n");
      argv_local._4_4_ = -1;
    }
    else {
      if (skip_ply_texcoords == 0) {
        change_extension_to_trc((char *)&include_stl_uint16,local_20);
      }
      nr_of_vertices = extension_is_stl(local_20);
      vertices._4_4_ = extension_is_ply(local_20);
      if ((nr_of_vertices == 0) && (vertices._4_4_ == 0)) {
        printf("I expect the input file to be of type stl or ply.\n");
        argv_local._4_4_ = -1;
      }
      else {
        vertices._0_4_ = 0;
        triangle_normals = (float *)0x0;
        vertex_normals = (float *)0x0;
        vertex_colors = (uint32_t *)0x0;
        puStack_480 = (uint32_t *)0x0;
        triangles._4_4_ = 0;
        texcoords = (float *)0x0;
        attributes = (uint16_t *)0x0;
        puStack_4a0 = (uint16_t *)0x0;
        if (nr_of_vertices != 0) {
          if ((output_filename == 0) && (skip_ply_normals == 0)) {
            arch._4_4_ = trico_read_stl((uint32_t *)&vertices,&triangle_normals,
                                        (uint32_t *)((long)&triangles + 4),(uint32_t **)&texcoords,
                                        local_20);
          }
          else {
            arch._4_4_ = trico_read_stl_full((uint32_t *)&vertices,&triangle_normals,
                                             (uint32_t *)((long)&triangles + 4),
                                             (uint32_t **)&texcoords,&vertex_normals,
                                             &stack0xfffffffffffffb60,local_20);
          }
          if (arch._4_4_ != 1) {
            printf("Not a valid stl file: %s\n",local_20);
            return -1;
          }
        }
        if ((vertices._4_4_ == 0) ||
           (iVar1 = trico_read_ply((uint32_t *)&vertices,&triangle_normals,(float **)&vertex_colors,
                                   &stack0xfffffffffffffb80,(uint32_t *)((long)&triangles + 4),
                                   (uint32_t **)&texcoords,(float **)&attributes,local_20),
           iVar1 == 1)) {
          a = trico_open_archive_for_writing(0x100000);
          if (((uint32_t)vertices == 0) ||
             ((triangle_normals == (float *)0x0 ||
              (iVar1 = trico_write_vertices(a,triangle_normals,(uint32_t)vertices), iVar1 != 0)))) {
            if ((triangles._4_4_ == 0) ||
               ((texcoords == (float *)0x0 ||
                (iVar1 = trico_write_triangles(a,(uint32_t *)texcoords,triangles._4_4_), iVar1 != 0)
                ))) {
              if (((nr_of_vertices == 0) ||
                  (((output_filename == 0 || (triangles._4_4_ == 0)) ||
                   (vertex_normals == (float *)0x0)))) ||
                 (iVar1 = trico_write_triangle_normals(a,vertex_normals,triangles._4_4_), iVar1 != 0
                 )) {
                if (((nr_of_vertices == 0) || (skip_ply_normals == 0)) ||
                   ((triangles._4_4_ == 0 ||
                    ((puStack_4a0 == (uint16_t *)0x0 ||
                     (iVar1 = trico_write_attributes_uint16(a,puStack_4a0,triangles._4_4_),
                     iVar1 != 0)))))) {
                  if ((vertices._4_4_ == 0) ||
                     ((((skip_ply_color != 0 || ((uint32_t)vertices == 0)) ||
                       (vertex_colors == (uint32_t *)0x0)) ||
                      (iVar1 = trico_write_vertex_normals
                                         (a,(float *)vertex_colors,(uint32_t)vertices), iVar1 != 0))
                     )) {
                    if (((vertices._4_4_ == 0) || (local_440 != 0)) ||
                       (((uint32_t)vertices == 0 ||
                        ((puStack_480 == (uint32_t *)0x0 ||
                         (iVar1 = trico_write_vertex_colors(a,puStack_480,(uint32_t)vertices),
                         iVar1 != 0)))))) {
                      if ((vertices._4_4_ == 0) ||
                         ((((j != 0 || (triangles._4_4_ == 0)) || (attributes == (uint16_t *)0x0))
                          || (iVar1 = trico_write_uv_per_triangle
                                                (a,(float *)attributes,triangles._4_4_), iVar1 != 0)
                          ))) {
                        trico_free(triangle_normals);
                        trico_free(vertex_colors);
                        trico_free(puStack_480);
                        trico_free(texcoords);
                        trico_free(attributes);
                        trico_free(vertex_normals);
                        trico_free(puStack_4a0);
                        __s = fopen((char *)&include_stl_uint16,"wb");
                        if (__s == (FILE *)0x0) {
                          printf("Cannot write to file %s\n",&include_stl_uint16);
                          argv_local._4_4_ = -1;
                        }
                        else {
                          __ptr = trico_get_buffer_pointer(a);
                          __size = trico_get_size(a);
                          fwrite(__ptr,__size,1,__s);
                          fclose(__s);
                          trico_close_archive(a);
                          argv_local._4_4_ = 0;
                        }
                      }
                      else {
                        printf("Something went wrong when writing the texture coordinates\n");
                        argv_local._4_4_ = -1;
                      }
                    }
                    else {
                      printf("Something went wrong when writing the vertex colors\n");
                      argv_local._4_4_ = -1;
                    }
                  }
                  else {
                    printf("Something went wrong when writing the vertex normals\n");
                    argv_local._4_4_ = -1;
                  }
                }
                else {
                  printf("Something went wrong when writing the uint16 attributes\n");
                  argv_local._4_4_ = -1;
                }
              }
              else {
                printf("Something went wrong when writing the triangle normals\n");
                argv_local._4_4_ = -1;
              }
            }
            else {
              printf("Something went wrong when writing the triangles\n");
              argv_local._4_4_ = -1;
            }
          }
          else {
            printf("Something went wrong when writing the vertices\n");
            argv_local._4_4_ = -1;
          }
        }
        else {
          printf("Not a valid ply file: %s\n",local_20);
          argv_local._4_4_ = -1;
        }
      }
    }
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, const char** argv)
  {
  if (argc < 3)
    {
    print_help();
    return -1;
    }
  const char* filename = NULL;
  char new_filename[1024];
  int include_stl_normals = 0;
  int include_stl_uint16 = 0;
  int output_filename = 0;
  int skip_ply_normals = 0;
  int skip_ply_texcoords = 0;
  int skip_ply_color = 0;

  for (int j = 1; j < argc; ++j)
    {
    if (strcmp(argv[j], "-i") == 0)
      {
      if (j == argc - 1)
        {
        printf("I expect a filename after command -i\n");
        return -1;
        }
      ++j;
      filename = argv[j];
      }
    else if (strcmp(argv[j], "-o") == 0)
      {
      if (j == argc - 1)
        {
        printf("I expect a filename after command -o\n");
        return -1;
        }
      ++j;
      const char* ptr = argv[j];
      int idx = 0;
      while (*ptr)
        new_filename[idx++] = *ptr++;
      new_filename[idx] = 0;
      output_filename = 1;
      }      
    else if (strcmp(argv[j], "-stladd") == 0)
      {
      if (j == argc - 1)
        {
        printf("I expect an attribute after command -stladd\n");
        return -1;
        }
      ++j;
      if (strcmp(argv[j], "normal") == 0)
        {
        skip_ply_normals = 1;
        }
      else if (strcmp(argv[j], "tex_coord") == 0)
        {
        skip_ply_texcoords = 1;
        }
      else if (strcmp(argv[j], "color") == 0)
        {
        skip_ply_color = 1;
        }
      else
        {
        printf("Unknown attribute %s\n", argv[j]);
        return -1;
        }
      }
    else if (strcmp(argv[j], "-plyskip") == 0)
      {
      if (j == argc - 1)
        {
        printf("I expect an attribute after command -plyskip\n");
        return -1;
        }
      ++j;
      if (strcmp(argv[j], "normal") == 0)
        {
        include_stl_normals = 1;
        }
      else if (strcmp(argv[j], "uint16") == 0)
        {
        include_stl_uint16 = 1;
        }
      else
        {
        printf("Unknown attribute %s\n", argv[j]);
        return -1;
        }
      }
    else
      {
      printf("Unknown command %s\n", argv[j]);
      return -1;
      }
    }

  if (!filename)
    {
    printf("An input file name is required\n");
    return -1;
    }

  if (!output_filename)
    {
    change_extension_to_trc(new_filename, filename);
    }

  int is_stl = extension_is_stl(filename);
  int is_ply = extension_is_ply(filename);

  if (!is_stl && !is_ply)
    {
    printf("I expect the input file to be of type stl or ply.\n");
    return -1;
    }

  uint32_t nr_of_vertices = 0;
  float* vertices = NULL;
  float* triangle_normals = NULL;
  float* vertex_normals = NULL;
  uint32_t* vertex_colors = NULL;
  uint32_t nr_of_triangles = 0;
  uint32_t* triangles = NULL;
  float* texcoords = NULL;
  uint16_t* attributes = NULL;

  int read_successfully = 0;

  if (is_stl)
    {
    if (include_stl_normals || include_stl_uint16)
      read_successfully = trico_read_stl_full(&nr_of_vertices, &vertices, &nr_of_triangles, &triangles, &triangle_normals, &attributes, filename);
    else
      read_successfully = trico_read_stl(&nr_of_vertices, &vertices, &nr_of_triangles, &triangles, filename);
    if (read_successfully != 1)
      {
      printf("Not a valid stl file: %s\n", filename);
      return -1;
      }
    }
  if (is_ply)
    {
    read_successfully = trico_read_ply(&nr_of_vertices, &vertices, &vertex_normals, &vertex_colors, &nr_of_triangles, &triangles, &texcoords, filename);
    if (read_successfully != 1)
      {
      printf("Not a valid ply file: %s\n", filename);
      return -1;
      }
    }  

  void* arch = trico_open_archive_for_writing(1024 * 1024);
  if (nr_of_vertices && vertices && !trico_write_vertices(arch, vertices, nr_of_vertices))
    {
    printf("Something went wrong when writing the vertices\n");
    return -1;
    }
  if (nr_of_triangles && triangles && !trico_write_triangles(arch, triangles, nr_of_triangles))
    {
    printf("Something went wrong when writing the triangles\n");
    return -1;
    }
  if (is_stl && include_stl_normals)
    {
    if (nr_of_triangles && triangle_normals && !trico_write_triangle_normals(arch, triangle_normals, nr_of_triangles))
      {
      printf("Something went wrong when writing the triangle normals\n");
      return -1;
      }
    }
  if (is_stl && include_stl_uint16)
    {
    if (nr_of_triangles && attributes && !trico_write_attributes_uint16(arch, attributes, nr_of_triangles))
      {
      printf("Something went wrong when writing the uint16 attributes\n");
      return -1;
      }
    }
  if (is_ply && !skip_ply_normals)
    {
    if (nr_of_vertices && vertex_normals && !trico_write_vertex_normals(arch, vertex_normals, nr_of_vertices))
      {
      printf("Something went wrong when writing the vertex normals\n");
      return -1;
      }      
    }
  if (is_ply && !skip_ply_color)
    {
    if (nr_of_vertices && vertex_colors && !trico_write_vertex_colors(arch, vertex_colors, nr_of_vertices))
      {
      printf("Something went wrong when writing the vertex colors\n");
      return -1;
      }
    }
  if (is_ply && !skip_ply_texcoords)
    {
    if (nr_of_triangles && texcoords && !trico_write_uv_per_triangle(arch, texcoords, nr_of_triangles))
      {
      printf("Something went wrong when writing the texture coordinates\n");
      return -1;
      }
    }

  trico_free(vertices);
  trico_free(vertex_normals);
  trico_free(vertex_colors);
  trico_free(triangles);
  trico_free(texcoords);
  trico_free(triangle_normals);
  trico_free(attributes);

  FILE* f = fopen(new_filename, "wb");
  if (!f)
    {
    printf("Cannot write to file %s\n", new_filename);
    return -1;
    }

  fwrite((const void*)trico_get_buffer_pointer(arch), trico_get_size(arch), 1, f);
  fclose(f);

  trico_close_archive(arch);

  return 0;
  }